

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit-customdata.cc
# Opt level: O2

void customdata_test(void)

{
  bool bVar1;
  allocator local_1a1;
  MetaVariable metavar2;
  string retval_str;
  int ival;
  MetaVariable metavar;
  double retval;
  CustomDataType customData;
  MetaVariable stringVal;
  MetaVariable intVal;
  MetaVariable doubleVal;
  
  intVal._value.v_.storage.dynamic = (void *)0x4008000000000000;
  tinyusdz::MetaVariable::MetaVariable<double>(&doubleVal,(double *)&intVal);
  stringVal._value.v_.storage._0_4_ = 9;
  tinyusdz::MetaVariable::MetaVariable<int>(&intVal,(int *)&stringVal);
  std::__cxx11::string::string((string *)&metavar,"dora",(allocator *)&metavar2);
  tinyusdz::MetaVariable::MetaVariable<std::__cxx11::string>
            (&stringVal,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&metavar);
  std::__cxx11::string::~string((string *)&metavar);
  customData._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &customData._M_t._M_impl.super__Rb_tree_header._M_header;
  customData._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  customData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  customData._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  customData._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       customData._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)&metavar,"hello:myval",(allocator *)&metavar2);
  bVar1 = tinyusdz::SetCustomDataByKey((string *)&metavar,&doubleVal,&customData);
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x1e,"%s","tinyusdz::SetCustomDataByKey(\"hello:myval\", doubleVal, customData)");
  std::__cxx11::string::~string((string *)&metavar);
  std::__cxx11::string::string((string *)&metavar,"hello:myval",(allocator *)&metavar2);
  bVar1 = tinyusdz::HasCustomDataKey(&customData,(string *)&metavar);
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x20,"%s","tinyusdz::HasCustomDataKey(customData, \"hello:myval\")");
  std::__cxx11::string::~string((string *)&metavar);
  metavar._value.v_.vtable = (vtable_type *)linb::any::vtable_for_type<decltype(nullptr)>()::table;
  metavar._value.v_.storage.dynamic = (void *)0x0;
  metavar._name._M_dataplus._M_p = (pointer)&metavar._name.field_2;
  metavar._name._M_string_length = 0;
  metavar._name.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&metavar2,"hello:myval",(allocator *)&retval_str);
  bVar1 = tinyusdz::GetCustomDataByKey(&customData,(string *)&metavar2,&metavar);
  std::__cxx11::string::~string((string *)&metavar2);
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x25,"%s","ret == true");
  retval = 0.0;
  tinyusdz::MetaVariable::get_value<double>(&metavar,&retval);
  acutest_check_(-(uint)(retval == 3.0) & 1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x2a,"%s","retval == 3.0");
  std::__cxx11::string::string((string *)&metavar2,"hello:myval2",(allocator *)&retval_str);
  bVar1 = tinyusdz::SetCustomDataByKey((string *)&metavar2,&stringVal,&customData);
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x2d,"%s","tinyusdz::SetCustomDataByKey(\"hello:myval2\", stringVal, customData)")
  ;
  std::__cxx11::string::~string((string *)&metavar2);
  std::__cxx11::string::string((string *)&metavar2,"hello:myval",(allocator *)&retval_str);
  bVar1 = tinyusdz::HasCustomDataKey(&customData,(string *)&metavar2);
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x2f,"%s","tinyusdz::HasCustomDataKey(customData, \"hello:myval\")");
  std::__cxx11::string::~string((string *)&metavar2);
  std::__cxx11::string::string((string *)&metavar2,"hello:myval2",(allocator *)&retval_str);
  bVar1 = tinyusdz::HasCustomDataKey(&customData,(string *)&metavar2);
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x30,"%s","tinyusdz::HasCustomDataKey(customData, \"hello:myval2\")");
  std::__cxx11::string::~string((string *)&metavar2);
  metavar2._value.v_.vtable = (vtable_type *)linb::any::vtable_for_type<decltype(nullptr)>()::table;
  metavar2._value.v_.storage.dynamic = (void *)0x0;
  metavar2._name._M_dataplus._M_p = (pointer)&metavar2._name.field_2;
  metavar2._name._M_string_length = 0;
  metavar2._name.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&retval_str,"hello:myval2",(allocator *)&ival);
  bVar1 = tinyusdz::GetCustomDataByKey(&customData,&retval_str,&metavar2);
  std::__cxx11::string::~string((string *)&retval_str);
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x35,"%s","ret == true");
  retval_str._M_dataplus._M_p = (pointer)&retval_str.field_2;
  retval_str._M_string_length = 0;
  retval_str.field_2._M_local_buf[0] = '\0';
  tinyusdz::MetaVariable::get_value<std::__cxx11::string>(&metavar2,&retval_str);
  bVar1 = std::operator==(&retval_str,"dora");
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x3a,"%s","retval_str == \"dora\"");
  std::__cxx11::string::string((string *)&ival,"hello:myval",&local_1a1);
  bVar1 = tinyusdz::SetCustomDataByKey((string *)&ival,&intVal,&customData);
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x3e,"%s","tinyusdz::SetCustomDataByKey(\"hello:myval\", intVal, customData)");
  std::__cxx11::string::~string((string *)&ival);
  std::__cxx11::string::string((string *)&ival,"hello:myval",&local_1a1);
  bVar1 = tinyusdz::GetCustomDataByKey(&customData,(string *)&ival,&metavar);
  std::__cxx11::string::~string((string *)&ival);
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x40,"%s","ret == true");
  ival = 0;
  tinyusdz::MetaVariable::get_value<int>(&metavar,&ival);
  acutest_check_((uint)(ival == 9),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x45,"%s","ival == 9");
  std::__cxx11::string::~string((string *)&retval_str);
  tinyusdz::MetaVariable::~MetaVariable(&metavar2);
  tinyusdz::MetaVariable::~MetaVariable(&metavar);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  ::~_Rb_tree(&customData._M_t);
  tinyusdz::MetaVariable::~MetaVariable(&stringVal);
  tinyusdz::MetaVariable::~MetaVariable(&intVal);
  tinyusdz::MetaVariable::~MetaVariable(&doubleVal);
  return;
}

Assistant:

void customdata_test(void) {

  MetaVariable doubleVal = double(3.0);
  MetaVariable intVal = int(9);
  MetaVariable stringVal = std::string("dora");

  CustomDataType customData;

  //
  // customData = {
  //    dictionary hello = {
  //      double myval = 3.0
  //    }
  // } 

  // Namespace ':' to create nested dictionary data.
  TEST_CHECK(tinyusdz::SetCustomDataByKey("hello:myval", doubleVal, customData));

  TEST_CHECK(tinyusdz::HasCustomDataKey(customData, "hello:myval"));

  MetaVariable metavar;
  bool ret = tinyusdz::GetCustomDataByKey(customData, "hello:myval", &metavar);

  TEST_CHECK(ret == true);

  double retval{0.0};
  metavar.get_value<double>(&retval);

  TEST_CHECK(retval == 3.0);

  // Add another key
  TEST_CHECK(tinyusdz::SetCustomDataByKey("hello:myval2", stringVal, customData));

  TEST_CHECK(tinyusdz::HasCustomDataKey(customData, "hello:myval"));
  TEST_CHECK(tinyusdz::HasCustomDataKey(customData, "hello:myval2"));

  MetaVariable metavar2;
  ret = tinyusdz::GetCustomDataByKey(customData, "hello:myval2", &metavar2);

  TEST_CHECK(ret == true);

  std::string retval_str;
  metavar2.get_value<std::string>(&retval_str);

  TEST_CHECK(retval_str == "dora");

  // override
  {
    TEST_CHECK(tinyusdz::SetCustomDataByKey("hello:myval", intVal, customData));
    ret = tinyusdz::GetCustomDataByKey(customData, "hello:myval", &metavar);
    TEST_CHECK(ret == true);

    int ival{0};
    metavar.get_value<int>(&ival);

    TEST_CHECK(ival == 9);
  }
}